

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall
llvm::yaml::Scanner::rollIndent(Scanner *this,int ToColumn,TokenKind Kind,iterator InsertPoint)

{
  Token local_58;
  
  if ((this->FlowLevel == 0) && (this->Indent < ToColumn)) {
    SmallVectorTemplateBase<int,_true>::push_back
              ((SmallVectorTemplateBase<int,_true> *)&this->Indents,&this->Indent);
    this->Indent = ToColumn;
    local_58.Value._M_dataplus._M_p = (pointer)&local_58.Value.field_2;
    local_58.Value._M_string_length = 0;
    local_58.Value.field_2._M_local_buf[0] = '\0';
    local_58.Range.Data = this->Current;
    local_58.Range.Length = 0;
    local_58.Kind = Kind;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::insert(&this->TokenQueue,InsertPoint,&local_58);
    std::__cxx11::string::_M_dispose();
  }
  return true;
}

Assistant:

bool Scanner::rollIndent( int ToColumn
                        , Token::TokenKind Kind
                        , TokenQueueT::iterator InsertPoint) {
  if (FlowLevel)
    return true;
  if (Indent < ToColumn) {
    Indents.push_back(Indent);
    Indent = ToColumn;

    Token T;
    T.Kind = Kind;
    T.Range = StringRef(Current, 0);
    TokenQueue.insert(InsertPoint, T);
  }
  return true;
}